

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O1

void update_buffer_level(AV1_COMP *cpi,int encoded_frame_size)

{
  aom_tune_content aVar1;
  uint uVar2;
  AV1_PRIMARY *pAVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int64_t *piVar8;
  double dVar9;
  
  pAVar3 = cpi->ppi;
  if ((cpi->common).show_frame == 0) {
    piVar8 = &(pAVar3->p_rc).bits_off_target;
    *piVar8 = *piVar8 - (long)encoded_frame_size;
  }
  else {
    piVar8 = &(pAVar3->p_rc).bits_off_target;
    *piVar8 = *piVar8 + ((long)(cpi->rc).avg_frame_bandwidth - (long)encoded_frame_size);
  }
  lVar4 = (pAVar3->p_rc).maximum_buffer_size;
  lVar5 = (pAVar3->p_rc).bits_off_target;
  if (lVar4 <= lVar5) {
    lVar5 = lVar4;
  }
  (pAVar3->p_rc).bits_off_target = lVar5;
  aVar1 = (cpi->oxcf).tune_cfg.content;
  if (aVar1 == AOM_CONTENT_SCREEN) {
    lVar6 = -lVar4;
    if (lVar5 != lVar6 && SBORROW8(lVar5,lVar6) == lVar5 + lVar4 < 0) {
      lVar6 = lVar5;
    }
    (pAVar3->p_rc).bits_off_target = lVar6;
  }
  (pAVar3->p_rc).buffer_level = (pAVar3->p_rc).bits_off_target;
  if (pAVar3->use_svc != 0) {
    uVar2 = (cpi->svc).temporal_layer_id;
    iVar7 = (cpi->svc).number_temporal_layers;
    if ((int)(uVar2 + 1) < iVar7) {
      piVar8 = &(cpi->svc).layer_context
                [(long)(int)uVar2 + (long)(cpi->svc).spatial_layer_id * (long)iVar7 + 1].p_rc.
                maximum_buffer_size;
      iVar7 = ~uVar2 + iVar7;
      do {
        dVar9 = round((double)piVar8[0x214] / (double)piVar8[0x216]);
        lVar5 = (long)((int)dVar9 - encoded_frame_size) + piVar8[0x1b];
        lVar4 = *piVar8;
        if (lVar4 <= lVar5) {
          lVar5 = lVar4;
        }
        piVar8[0x1b] = lVar5;
        piVar8[0x17] = lVar5;
        if (aVar1 == AOM_CONTENT_SCREEN) {
          lVar6 = -lVar4;
          if (lVar5 != lVar6 && SBORROW8(lVar5,lVar6) == lVar5 + lVar4 < 0) {
            lVar6 = lVar5;
          }
          piVar8[0x1b] = lVar6;
          piVar8[0x17] = lVar6;
        }
        piVar8 = piVar8 + 0x670;
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
    }
  }
  return;
}

Assistant:

static void update_buffer_level(AV1_COMP *cpi, int encoded_frame_size) {
  const AV1_COMMON *const cm = &cpi->common;
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;

  // Non-viewable frames are a special case and are treated as pure overhead.
  if (!cm->show_frame)
    p_rc->bits_off_target -= encoded_frame_size;
  else
    p_rc->bits_off_target += rc->avg_frame_bandwidth - encoded_frame_size;

  // Clip the buffer level to the maximum specified buffer size.
  p_rc->bits_off_target =
      AOMMIN(p_rc->bits_off_target, p_rc->maximum_buffer_size);
  // For screen-content mode: don't let buffer level go below threshold,
  // given here as -rc->maximum_ buffer_size, to allow buffer to come back
  // up sooner after slide change with big overshoot.
  if (cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN)
    p_rc->bits_off_target =
        AOMMAX(p_rc->bits_off_target, -p_rc->maximum_buffer_size);
  p_rc->buffer_level = p_rc->bits_off_target;

  if (cpi->ppi->use_svc)
    update_layer_buffer_level(&cpi->svc, encoded_frame_size,
                              cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN);

#if CONFIG_FPMT_TEST
  /* The variable temp_buffer_level is introduced for quality
   * simulation purpose, it retains the value previous to the parallel
   * encode frames. The variable is updated based on the update flag.
   *
   * If there exist show_existing_frames between parallel frames, then to
   * retain the temp state do not update it. */
  int show_existing_between_parallel_frames =
      (cpi->ppi->gf_group.update_type[cpi->gf_frame_index] ==
           INTNL_OVERLAY_UPDATE &&
       cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index + 1] == 2);

  if (cpi->do_frame_data_update && !show_existing_between_parallel_frames &&
      cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE) {
    p_rc->temp_buffer_level = p_rc->buffer_level;
  }
#endif
}